

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O2

void __thiscall HuffmanEncoder::run(HuffmanEncoder *this)

{
  string *psVar1;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  int iVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  HuffmanNode *pHVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  char *c;
  key_type *__k;
  element_type *__k_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  shared_ptr<HuffmanNode> node;
  value_type right_son;
  shared_ptr<HuffmanNode> parent;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  string local_1d8 [32];
  stringstream output;
  long local_1b0;
  basic_ostream<char,_std::char_traits<char>_> local_1a8 [376];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Huffman encryption...");
  std::endl<char,std::char_traits<char>>(poVar3);
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symbols._M_t._M_impl.super__Rb_tree_header._M_header;
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar1 = &(this->super_Cryptor).in_message_;
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&output,(string *)psVar1);
  __k = _output;
  for (; local_1b0 != 0; local_1b0 = local_1b0 + -1) {
    pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&symbols,__k);
    *pmVar4 = *pmVar4 + 1;
    __k = __k + 1;
  }
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(symbols._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xff);
  std::operator<<(local_1a8,(bitset<8UL> *)&node);
  std::ostream::flush();
  this_00 = &this->nodes_;
  for (p_Var6 = symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &symbols._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(ulong)(byte)(char)p_Var6[1]._M_color;
    __os = std::operator<<(local_1a8,(bitset<8UL> *)&node);
    right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(ulong)(byte)p_Var6[1].field_0x4;
    std::operator<<(__os,(bitset<8UL> *)&right_son);
    std::ostream::flush();
    pHVar5 = (HuffmanNode *)operator_new(0x28);
    iVar2 = *(int *)&p_Var6[1].field_0x4;
    pHVar5->c_ = (char)p_Var6[1]._M_color;
    pHVar5->n_ = iVar2;
    (pHVar5->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pHVar5->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pHVar5->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pHVar5->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HuffmanNode,void>
              ((__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2> *)&node,pHVar5);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(this_00,(value_type *)&node);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  while (1 < (this->nodes_).
             super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
             ._M_impl._M_node._M_size) {
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::sort<HuffmanComparator>(this_00);
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)
               ((this_00->
                super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_00);
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)
               ((this_00->
                super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_00);
    pHVar5 = (HuffmanNode *)operator_new(0x28);
    HuffmanNode::HuffmanNode
              (pHVar5,(shared_ptr<HuffmanNode> *)
                      &node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
               (shared_ptr<HuffmanNode> *)
               &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HuffmanNode,void>
              ((__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2> *)&parent,pHVar5);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(this_00,(value_type *)&parent);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  build(this,(shared_ptr<HuffmanNode> *)
             ((this->nodes_).
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
              ._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::string::string((string *)&node,(string *)psVar1);
  __k_00 = node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (_Var8 = node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      _Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&_Var8._M_pi[-1]._M_weak_count + 3)) {
    pmVar7 = std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->table_,&__k_00->c_);
    std::operator<<(local_1a8,(string *)pmVar7);
    std::ostream::flush();
    __k_00 = (element_type *)&__k_00->field_0x1;
  }
  std::__cxx11::string::~string((string *)&node);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  poVar3 = std::operator<<((ostream *)&std::cout,"encryption done!");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&symbols._M_t);
  return;
}

Assistant:

void HuffmanEncoder::run() {
  cout << "Huffman encryption..." << endl;

  //find number of occurrence of each symbol
  map<char, int> symbols;
  for (auto& c : get_in_message()) {
    symbols[c]++;
  }

  //initial list of leaves & saving to output
  stringstream output;
  output << bitset<8>(symbols.size()) << flush;
  for (auto& symbol : symbols) {
    output << bitset<8>(static_cast<unsigned long long int>(symbol.first))
      << bitset<8>(static_cast<unsigned long long int>(symbol.second)) << flush;
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  //building code table
  build(nodes_.front());

  //saving encoded message
  for (auto& c : get_in_message()) {
    output << table_[c] << flush;
  }
  set_out_message(output.str());

  cout << "encryption done!" << endl;
}